

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O3

int __thiscall
notch::core::ActivationLayer::clone
          (ActivationLayer *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  _func_int **local_28;
  element_type *peStack_20;
  
  makeClone((ActivationLayer *)&stack0xffffffffffffffd8);
  (this->super_ABackpropLayer)._vptr_ABackpropLayer = local_28;
  (this->super_ABackpropLayer).shared.inputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_20;
  return (int)this;
}

Assistant:

virtual std::shared_ptr<ABackpropLayer> clone() const { return makeClone(); }